

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

proficiency_type * __thiscall
CProficiencies::GetProficiency
          (proficiency_type *__return_storage_ptr__,CProficiencies *this,char *profname)

{
  char *pcVar1;
  int iVar2;
  bool bVar3;
  __normal_iterator<const_proficiency_type_*,_std::vector<proficiency_type,_std::allocator<proficiency_type>_>_>
  _Var4;
  long lVar5;
  long lVar6;
  __normal_iterator<const_proficiency_type_*,_std::vector<proficiency_type,_std::allocator<proficiency_type>_>_>
  __it;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  char *local_40;
  proficiency_type *local_38;
  
  if (profname != (char *)0x0) {
    local_38 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    lVar5 = (long)prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    __it._M_current =
         prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_40 = profname;
    for (lVar6 = lVar5 / 0x28 >> 2; _Var4._M_current = __it._M_current, 0 < lVar6;
        lVar6 = lVar6 + -1) {
      bVar3 = __gnu_cxx::__ops::_Iter_pred<CProficiencies::GetProficiency(char*)::$_0>::operator()
                        ((_Iter_pred<CProficiencies::GetProficiency(char*)::__0> *)&local_40,__it);
      if (bVar3) goto LAB_003b2519;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<CProficiencies::GetProficiency(char*)::$_0>::operator()
                        ((_Iter_pred<CProficiencies::GetProficiency(char*)::__0> *)&local_40,
                         __it._M_current + 1);
      _Var4._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_003b2519;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<CProficiencies::GetProficiency(char*)::$_0>::operator()
                        ((_Iter_pred<CProficiencies::GetProficiency(char*)::__0> *)&local_40,
                         __it._M_current + 2);
      _Var4._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_003b2519;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<CProficiencies::GetProficiency(char*)::$_0>::operator()
                        ((_Iter_pred<CProficiencies::GetProficiency(char*)::__0> *)&local_40,
                         __it._M_current + 3);
      _Var4._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_003b2519;
      __it._M_current = __it._M_current + 4;
      lVar5 = lVar5 + -0xa0;
    }
    lVar5 = lVar5 / 0x28;
    if (lVar5 == 1) {
LAB_003b257b:
      bVar3 = __gnu_cxx::__ops::_Iter_pred<CProficiencies::GetProficiency(char*)::$_0>::operator()
                        ((_Iter_pred<CProficiencies::GetProficiency(char*)::__0> *)&local_40,__it);
      _Var4._M_current = local_38;
      if (bVar3) {
        _Var4._M_current = __it._M_current;
      }
    }
    else if (lVar5 == 2) {
LAB_003b24f9:
      bVar3 = __gnu_cxx::__ops::_Iter_pred<CProficiencies::GetProficiency(char*)::$_0>::operator()
                        ((_Iter_pred<CProficiencies::GetProficiency(char*)::__0> *)&local_40,_Var4);
      if (!bVar3) {
        __it._M_current = _Var4._M_current + 1;
        goto LAB_003b257b;
      }
    }
    else {
      _Var4._M_current = local_38;
      if ((lVar5 == 3) &&
         (bVar3 = __gnu_cxx::__ops::_Iter_pred<CProficiencies::GetProficiency(char*)::$_0>::
                  operator()((_Iter_pred<CProficiencies::GetProficiency(char*)::__0> *)&local_40,
                             __it), _Var4._M_current = __it._M_current, !bVar3)) {
        _Var4._M_current = __it._M_current + 1;
        goto LAB_003b24f9;
      }
    }
LAB_003b2519:
    if (_Var4._M_current !=
        prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __return_storage_ptr__->flags = (_Var4._M_current)->flags;
      uVar7 = *(undefined4 *)&(_Var4._M_current)->ppsn;
      uVar8 = *(undefined4 *)((long)&(_Var4._M_current)->ppsn + 4);
      uVar9 = *(undefined4 *)&(_Var4._M_current)->name;
      uVar10 = *(undefined4 *)((long)&(_Var4._M_current)->name + 4);
      iVar2 = (_Var4._M_current)->minlevel;
      pcVar1 = (_Var4._M_current)->requires;
      __return_storage_ptr__->cost = (_Var4._M_current)->cost;
      __return_storage_ptr__->minlevel = iVar2;
      __return_storage_ptr__->requires = pcVar1;
      goto LAB_003b2552;
    }
  }
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->cost = 0;
  __return_storage_ptr__->minlevel = 0;
  __return_storage_ptr__->requires = (char *)0x0;
  uVar7 = 0x5550fa;
  uVar8 = 0;
  uVar9 = 0x3dff64;
  uVar10 = 0;
LAB_003b2552:
  *(undefined4 *)&__return_storage_ptr__->ppsn = uVar7;
  *(undefined4 *)((long)&__return_storage_ptr__->ppsn + 4) = uVar8;
  *(undefined4 *)&__return_storage_ptr__->name = uVar9;
  *(undefined4 *)((long)&__return_storage_ptr__->name + 4) = uVar10;
  return __return_storage_ptr__;
}

Assistant:

proficiency_type CProficiencies::GetProficiency(char* profname)
{
	proficiency_type result = { &psn_none, "", 0, 0, nullptr, PFLAGS_NONE };
	if(profname == nullptr)
		return result;

	auto it = std::find_if(prof_table.begin(), prof_table.end(), [profname] (auto prof) {
		return prof.name != nullptr && !str_cmp(prof.name, profname);
	});

	if (it == prof_table.end())
		return result;
	
	auto idx = it - prof_table.begin();
	return prof_table[idx];
}